

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_rejects_table.cpp
# Opt level: O3

shared_ptr<duckdb::CSVRejectsTable,_true> __thiscall
duckdb::CSVRejectsTable::GetOrCreate
          (CSVRejectsTable *this,ClientContext *context,string *rejects_scan,string *rejects_error)

{
  ulong uVar1;
  ulong *puVar2;
  size_t __n;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  ObjectCache *key_00;
  Catalog *this_00;
  optional_ptr<duckdb::TableCatalogEntry,_true> oVar6;
  optional_ptr<duckdb::TableCatalogEntry,_true> oVar7;
  ostream *poVar8;
  BinderException *pBVar9;
  size_type *psVar10;
  ulong *puVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ulong uVar13;
  undefined8 uVar14;
  shared_ptr<duckdb::CSVRejectsTable,_true> sVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  ostringstream error;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  undefined1 local_1c8 [376];
  string local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  
  __n = rejects_scan->_M_string_length;
  if (__n == rejects_error->_M_string_length) {
    if (__n == 0) {
LAB_016baf57:
      pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
      local_1c8._0_8_ = local_1c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,
                 "The names of the rejects scan and rejects error tables can\'t be the same. Use different names for these tables."
                 ,"");
      BinderException::BinderException(pBVar9,(string *)local_1c8);
      __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar3 = bcmp((rejects_scan->_M_dataplus)._M_p,(rejects_error->_M_dataplus)._M_p,__n);
    if (iVar3 == 0) goto LAB_016baf57;
  }
  StringUtil::Upper(&local_50,rejects_scan);
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1e09f83);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  psVar10 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228.field_2._8_8_ = plVar4[3];
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar10;
    local_228._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_228._M_string_length = plVar4[1];
  *plVar4 = (long)psVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_228);
  puVar2 = (ulong *)(local_1c8 + 0x10);
  puVar11 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar11) {
    local_1c8._16_8_ = *puVar11;
    local_1c8._24_8_ = plVar4[3];
    local_1c8._0_8_ = puVar2;
  }
  else {
    local_1c8._16_8_ = *puVar11;
    local_1c8._0_8_ = (ulong *)*plVar4;
  }
  local_1c8._8_8_ = plVar4[1];
  *plVar4 = (long)puVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  StringUtil::Upper(&local_1e8,rejects_error);
  uVar1 = (long)(_func_int ***)local_1c8._8_8_ + local_1e8._M_string_length;
  uVar13 = 0xf;
  if ((ulong *)local_1c8._0_8_ != puVar2) {
    uVar13 = local_1c8._16_8_;
  }
  if (uVar13 < uVar1) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar14 = local_1e8.field_2._M_allocated_capacity;
    }
    if (uVar1 <= (ulong)uVar14) {
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,local_1c8._0_8_);
      goto LAB_016bad6a;
    }
  }
  puVar5 = (undefined8 *)
           ::std::__cxx11::string::_M_append(local_1c8,(ulong)local_1e8._M_dataplus._M_p);
LAB_016bad6a:
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar10 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_208.field_2._M_allocated_capacity = *psVar10;
    local_208.field_2._8_8_ = puVar5[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar10;
    local_208._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_208._M_string_length = puVar5[1];
  *puVar5 = psVar10;
  puVar5[1] = 0;
  *(undefined1 *)psVar10 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((ulong *)local_1c8._0_8_ != puVar2) {
    operator_delete((void *)local_1c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  key_00 = ObjectCache::GetObjectCache(context);
  local_1c8._0_8_ = puVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"temp","");
  this_00 = Catalog::GetCatalog(context,(string *)local_1c8);
  if ((ulong *)local_1c8._0_8_ != puVar2) {
    operator_delete((void *)local_1c8._0_8_);
  }
  local_1c8._0_8_ = puVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"main","");
  oVar6 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                    (this_00,context,(string *)local_1c8,rejects_scan,RETURN_NULL,
                     (QueryErrorContext)0xffffffffffffffff);
  if ((ulong *)local_1c8._0_8_ != puVar2) {
    operator_delete((void *)local_1c8._0_8_);
  }
  local_1c8._0_8_ = puVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"main","");
  oVar7 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                    (this_00,context,(string *)local_1c8,rejects_error,RETURN_NULL,
                     (QueryErrorContext)0xffffffffffffffff);
  if ((ulong *)local_1c8._0_8_ != puVar2) {
    operator_delete((void *)local_1c8._0_8_);
  }
  if (oVar6.ptr != (TableCatalogEntry *)0x0 || oVar7.ptr != (TableCatalogEntry *)0x0) {
    ObjectCache::Get<duckdb::CSVRejectsTable>((ObjectCache *)local_1c8,(string *)key_00);
    uVar14 = local_1c8._0_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
    }
    if ((ulong *)uVar14 == (ulong *)0x0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      if (oVar6.ptr != (TableCatalogEntry *)0x0) {
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"Reject Scan Table name \"",0x18);
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c8,(rejects_scan->_M_dataplus)._M_p,
                            rejects_scan->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" is already in use. ",0x15);
      }
      if (oVar7.ptr != (TableCatalogEntry *)0x0) {
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"Reject Error Table name \"",0x19);
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c8,(rejects_error->_M_dataplus)._M_p,
                            rejects_error->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" is already in use. ",0x15);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "Either drop the used name(s), or give other name options in the CSV Reader function.\n"
                 ,0x55);
      pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::stringbuf::str();
      BinderException::BinderException(pBVar9,&local_228);
      __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  sVar15 = ObjectCache::
           GetOrCreate<duckdb::CSVRejectsTable,std::__cxx11::string_const&,std::__cxx11::string_const&>
                     ((ObjectCache *)this,(string *)key_00,&local_208,rejects_scan);
  _Var12._M_pi = sVar15.internal.
                 super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
    _Var12._M_pi = extraout_RDX;
  }
  sVar15.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var12._M_pi;
  sVar15.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::CSVRejectsTable,_true>)
         sVar15.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<CSVRejectsTable> CSVRejectsTable::GetOrCreate(ClientContext &context, const string &rejects_scan,
                                                         const string &rejects_error) {
	// Check that these names can't be the same
	if (rejects_scan == rejects_error) {
		throw BinderException("The names of the rejects scan and rejects error tables can't be the same. Use different "
		                      "names for these tables.");
	}
	auto key =
	    "CSV_REJECTS_TABLE_CACHE_ENTRY_" + StringUtil::Upper(rejects_scan) + "_" + StringUtil::Upper(rejects_error);
	auto &cache = ObjectCache::GetObjectCache(context);
	auto &catalog = Catalog::GetCatalog(context, TEMP_CATALOG);
	auto rejects_scan_exist = catalog.GetEntry<TableCatalogEntry>(context, DEFAULT_SCHEMA, rejects_scan,
	                                                              OnEntryNotFound::RETURN_NULL) != nullptr;
	auto rejects_error_exist = catalog.GetEntry<TableCatalogEntry>(context, DEFAULT_SCHEMA, rejects_error,
	                                                               OnEntryNotFound::RETURN_NULL) != nullptr;
	if ((rejects_scan_exist || rejects_error_exist) && !cache.Get<CSVRejectsTable>(key)) {
		std::ostringstream error;
		if (rejects_scan_exist) {
			error << "Reject Scan Table name \"" << rejects_scan << "\" is already in use. ";
		}
		if (rejects_error_exist) {
			error << "Reject Error Table name \"" << rejects_error << "\" is already in use. ";
		}
		error << "Either drop the used name(s), or give other name options in the CSV Reader function.\n";
		throw BinderException(error.str());
	}

	return cache.GetOrCreate<CSVRejectsTable>(key, rejects_scan, rejects_error);
}